

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

mk_vhost_handler *
mk_vhost_handler_match(char *match,_func_void_mk_http_request_ptr_void_ptr *cb,void *data)

{
  int iVar1;
  void *pvVar2;
  mk_vhost_handler *h;
  int ret;
  void *data_local;
  _func_void_mk_http_request_ptr_void_ptr *cb_local;
  char *match_local;
  
  match_local = (char *)mk_mem_alloc(0x50);
  if ((long *)match_local == (long *)0x0) {
    match_local = (char *)0x0;
  }
  else {
    *(long *)((long)match_local + 8) = 0;
    *(_func_void_mk_http_request_ptr_void_ptr **)((long)match_local + 0x18) = cb;
    *(void **)((long)match_local + 0x20) = data;
    pvVar2 = mk_mem_alloc(0x2000);
    *(void **)match_local = pvVar2;
    if (*(long *)match_local == 0) {
      mk_mem_free(match_local);
      match_local = (char *)0x0;
    }
    else {
      mk_list_init((mk_list *)((long)match_local + 0x28));
      iVar1 = str_to_regex(match,*(regex_t **)match_local);
      if (iVar1 == -1) {
        mk_mem_free(match_local);
        match_local = (char *)0x0;
      }
    }
  }
  return (mk_vhost_handler *)match_local;
}

Assistant:

struct mk_vhost_handler *mk_vhost_handler_match(char *match,
                                                void (*cb)(struct mk_http_request *,
                                                           void *),
                                                void *data)
{
    int ret;
    struct mk_vhost_handler *h;

    h = mk_mem_alloc(sizeof(struct mk_vhost_handler));
    if (!h) {
        return NULL;
    }
    h->name  = NULL;
    h->cb    = cb;
    h->data  = data;
    h->match = mk_mem_alloc(REGEXP_SIZE);
    if (!h->match) {
        mk_mem_free(h);
        return NULL;
    }
    mk_list_init(&h->params);

    ret = str_to_regex(match, h->match);
    if (ret == -1) {
        mk_mem_free(h);
        return NULL;
    }

    return h;
}